

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCGeometry.cpp
# Opt level: O0

void Assimp::IFC::ProcessRevolvedAreaSolid
               (IfcRevolvedAreaSolid *solid,TempMesh *result,ConversionData *conv)

{
  size_t sVar1;
  bool bVar2;
  IfcProfileDef *pIVar3;
  size_type sVar4;
  IfcAxis1Placement *in_00;
  uint *puVar5;
  aiMatrix4x4t<double> *m;
  const_reference __x;
  reference pvVar6;
  IfcAxis2Placement3D *in_01;
  ulong uVar7;
  bool local_519;
  bool local_50a;
  undefined1 local_4e0 [8];
  IfcMatrix4 trafo;
  ulong local_458;
  size_t i_3;
  size_t i_2;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_440;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_438;
  const_iterator local_430;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_428;
  const_iterator local_420;
  aiVector3t<double> local_418;
  aiVector3t<double> local_400;
  undefined1 auStack_3e8 [8];
  IfcVector3 base_1;
  undefined1 auStack_3c8 [8];
  IfcVector3 base_0;
  size_t next;
  size_t i_1;
  uint seg;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_388;
  const_iterator local_380;
  ulong local_378;
  size_t i;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *out;
  size_t base;
  aiMatrix4x4t<double> local_2e0;
  undefined1 local_260 [8];
  IfcMatrix4 rot;
  IfcFloat delta;
  uint local_1d0;
  uint local_1cc;
  double dStack_1c8;
  uint cnt_segments;
  IfcFloat max_angle;
  undefined4 uStack_1b8;
  bool has_area;
  size_t size;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *in;
  undefined1 local_190 [8];
  IfcMatrix4 tb1;
  IfcMatrix4 tb0;
  IfcVector3 pos;
  IfcVector3 axis;
  undefined1 local_50 [8];
  TempMesh meshout;
  ConversionData *conv_local;
  TempMesh *result_local;
  IfcRevolvedAreaSolid *solid_local;
  
  meshout.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)conv;
  TempMesh::TempMesh((TempMesh *)local_50);
  pIVar3 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>::operator*
                     ((Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef> *)
                      &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
  bVar2 = ProcessProfile(pIVar3,(TempMesh *)local_50,
                         (ConversionData *)
                         meshout.mVertcnt.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  if ((bVar2) &&
     (sVar4 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                        ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                         local_50), 1 < sVar4)) {
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)&pos.z);
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)&tb0.d4);
    in_00 = STEP::Lazy::operator_cast_to_IfcAxis1Placement_
                      ((Lazy *)&(solid->super_IfcSweptAreaSolid).field_0x60);
    ConvertAxisPlacement((IfcVector3 *)&pos.z,(IfcVector3 *)&tb0.d4,in_00);
    aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)&tb1.d4);
    aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_190);
    aiMatrix4x4t<double>::Translation((aiVector3t<double> *)&tb0.d4,(aiMatrix4x4t<double> *)&tb1.d4)
    ;
    ::operator-((aiVector3t<double> *)&in,(aiVector3t<double> *)&tb0.d4);
    aiMatrix4x4t<double>::Translation((aiVector3t<double> *)&in,(aiMatrix4x4t<double> *)local_190);
    size = (size_t)local_50;
    _uStack_1b8 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             size);
    pIVar3 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>::operator->
                       ((Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef> *)
                        &(solid->super_IfcSweptAreaSolid).super_IfcSolidModel.field_0x40);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(pIVar3->
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                             field_0x10,"AREA");
    local_50a = bVar2 && 2 < _uStack_1b8;
    max_angle._7_1_ = local_50a;
    dStack_1c8 = solid->Angle *
                 *(double *)
                  (meshout.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 2);
    if (0.001 <= ABS(dStack_1c8)) {
      local_1d0 = 2;
      delta._4_4_ = (undefined4)
                    (long)(((double)*(int *)(*(long *)(meshout.mVertcnt.
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 0x50) + 8) * ABS(dStack_1c8)) /
                          1.5707963705062866);
      puVar5 = std::max<unsigned_int>(&local_1d0,(uint *)((long)&delta + 4));
      local_1cc = *puVar5;
      rot.d4 = dStack_1c8 / (double)local_1cc;
      local_519 = (max_angle._7_1_ & 1) != 0 && ABS(dStack_1c8) < 6.220353627204895;
      max_angle._7_1_ = local_519;
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&result->mVerts,_uStack_1b8 * ((uint)local_519 * 2 + 4 + local_1cc * 4));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                (&result->mVertcnt,_uStack_1b8 * local_1cc + 2);
      aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_260);
      m = aiMatrix4x4t<double>::Rotation
                    (rot.d4,(aiVector3t<double> *)&pos.z,(aiMatrix4x4t<double> *)local_260);
      aiMatrix4x4t<double>::operator*
                ((aiMatrix4x4t<double> *)&base,(aiMatrix4x4t<double> *)&tb1.d4,m);
      aiMatrix4x4t<double>::operator*
                (&local_2e0,(aiMatrix4x4t<double> *)&base,(aiMatrix4x4t<double> *)local_190);
      memcpy(local_260,&local_2e0,0x80);
      out = (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)0x0;
      i = (size_t)result;
      for (local_378 = 0; sVar1 = i, local_378 < _uStack_1b8; local_378 = local_378 + 1) {
        local_388._M_current =
             (aiVector3t<double> *)
             std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                       ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)i);
        __gnu_cxx::
        __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
        ::__normal_iterator<aiVector3t<double>*>
                  ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                    *)&local_380,&local_388);
        __x = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                        ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)size,
                         local_378);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::insert
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar1,
                   local_380,4,__x);
      }
      for (i_1._4_4_ = 0; sVar1 = i, i_1._4_4_ < local_1cc; i_1._4_4_ = i_1._4_4_ + 1) {
        for (next = 0; next < _uStack_1b8; next = next + 1) {
          uVar7 = (next + 1) % _uStack_1b8;
          base_0.z._4_4_ = 4;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&result->mVertcnt,(value_type_conflict4 *)((long)&base_0.z + 4));
          pvVar6 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                             ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)i,
                              (long)&(out->
                                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + next * 4 + 3);
          base_0.y = pvVar6->z;
          auStack_3c8 = (undefined1  [8])pvVar6->x;
          base_0.x = pvVar6->y;
          pvVar6 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                             ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)i,
                              (long)&(out->
                                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + uVar7 * 4 + 3);
          base_1.y = pvVar6->z;
          auStack_3e8 = (undefined1  [8])pvVar6->x;
          base_1.x = pvVar6->y;
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)i,
                     (value_type *)auStack_3c8);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)i,
                     (value_type *)auStack_3e8);
          sVar1 = i;
          ::operator*(&local_400,(aiMatrix4x4t<double> *)local_260,(aiVector3t<double> *)auStack_3e8
                     );
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar1,
                     &local_400);
          sVar1 = i;
          ::operator*(&local_418,(aiMatrix4x4t<double> *)local_260,(aiVector3t<double> *)auStack_3c8
                     );
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar1,
                     &local_418);
        }
        out = (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
              ((long)&(out->
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                      _M_impl.super__Vector_impl_data._M_start + _uStack_1b8 * 4);
      }
      local_428._M_current =
           (aiVector3t<double> *)
           std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                     ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)i);
      __gnu_cxx::
      __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
      ::__normal_iterator<aiVector3t<double>*>
                ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                  *)&local_420,&local_428);
      local_440._M_current =
           (aiVector3t<double> *)
           std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                     ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)i);
      local_438 = __gnu_cxx::
                  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  ::operator+(&local_440,_uStack_1b8 << 2);
      __gnu_cxx::
      __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
      ::__normal_iterator<aiVector3t<double>*>
                ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                  *)&local_430,&local_438);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::erase
                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar1,local_420
                 ,local_430);
      if ((max_angle._7_1_ & 1) != 0) {
        out = (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
              ((long)out + _uStack_1b8 * -8);
        i_3 = _uStack_1b8;
        while (sVar1 = i, i_3 != 0) {
          pvVar6 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                             ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)i,
                              (long)out + (i_3 - 1) * 4 + 3);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar1,
                     pvVar6);
          i_3 = i_3 - 1;
        }
        for (local_458 = 0; sVar1 = i, local_458 < _uStack_1b8; local_458 = local_458 + 1) {
          pvVar6 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                             ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)i,
                              local_458 << 2);
          std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                    ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)sVar1,
                     pvVar6);
        }
        trafo.d4._4_4_ = uStack_1b8;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&result->mVertcnt,(value_type_conflict4 *)((long)&trafo.d4 + 4));
        trafo.d4._0_4_ = uStack_1b8;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&result->mVertcnt,(value_type_conflict4 *)&trafo.d4);
      }
      aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)local_4e0);
      in_01 = STEP::Lazy::operator_cast_to_IfcAxis2Placement3D_
                        ((Lazy *)&(solid->super_IfcSweptAreaSolid).Position);
      ConvertAxisPlacement((IfcMatrix4 *)local_4e0,in_01);
      TempMesh::Transform(result,(IfcMatrix4 *)local_4e0);
      LogFunctions<Assimp::IFCImporter>::LogDebug
                ("generate mesh procedurally by radial extrusion (IfcRevolvedAreaSolid)");
    }
    else if (bVar2 && 2 < _uStack_1b8) {
      TempMesh::operator=(result,(TempMesh *)local_50);
    }
  }
  TempMesh::~TempMesh((TempMesh *)local_50);
  return;
}

Assistant:

void ProcessRevolvedAreaSolid(const Schema_2x3::IfcRevolvedAreaSolid& solid, TempMesh& result, ConversionData& conv)
{
    TempMesh meshout;

    // first read the profile description
    if(!ProcessProfile(*solid.SweptArea,meshout,conv) || meshout.mVerts.size()<=1) {
        return;
    }

    IfcVector3 axis, pos;
    ConvertAxisPlacement(axis,pos,solid.Axis);

    IfcMatrix4 tb0,tb1;
    IfcMatrix4::Translation(pos,tb0);
    IfcMatrix4::Translation(-pos,tb1);

    const std::vector<IfcVector3>& in = meshout.mVerts;
    const size_t size=in.size();

    bool has_area = solid.SweptArea->ProfileType == "AREA" && size>2;
    const IfcFloat max_angle = solid.Angle*conv.angle_scale;
    if(std::fabs(max_angle) < 1e-3) {
        if(has_area) {
            result = meshout;
        }
        return;
    }

    const unsigned int cnt_segments = std::max(2u,static_cast<unsigned int>(conv.settings.cylindricalTessellation * std::fabs(max_angle)/AI_MATH_HALF_PI_F));
    const IfcFloat delta = max_angle/cnt_segments;

    has_area = has_area && std::fabs(max_angle) < AI_MATH_TWO_PI_F*0.99;

    result.mVerts.reserve(size*((cnt_segments+1)*4+(has_area?2:0)));
    result.mVertcnt.reserve(size*cnt_segments+2);

    IfcMatrix4 rot;
    rot = tb0 * IfcMatrix4::Rotation(delta,axis,rot) * tb1;

    size_t base = 0;
    std::vector<IfcVector3>& out = result.mVerts;

    // dummy data to simplify later processing
    for(size_t i = 0; i < size; ++i) {
        out.insert(out.end(),4,in[i]);
    }

    for(unsigned int seg = 0; seg < cnt_segments; ++seg) {
        for(size_t i = 0; i < size; ++i) {
            const size_t next = (i+1)%size;

            result.mVertcnt.push_back(4);
            const IfcVector3 base_0 = out[base+i*4+3],base_1 = out[base+next*4+3];

            out.push_back(base_0);
            out.push_back(base_1);
            out.push_back(rot*base_1);
            out.push_back(rot*base_0);
        }
        base += size*4;
    }

    out.erase(out.begin(),out.begin()+size*4);

    if(has_area) {
        // leave the triangulation of the profile area to the ear cutting
        // implementation in aiProcess_Triangulate - for now we just
        // feed in two huge polygons.
        base -= size*8;
        for(size_t i = size; i--; ) {
            out.push_back(out[base+i*4+3]);
        }
        for(size_t i = 0; i < size; ++i ) {
            out.push_back(out[i*4]);
        }
        result.mVertcnt.push_back(static_cast<unsigned int>(size));
        result.mVertcnt.push_back(static_cast<unsigned int>(size));
    }

    IfcMatrix4 trafo;
    ConvertAxisPlacement(trafo, solid.Position);

    result.Transform(trafo);
    IFCImporter::LogDebug("generate mesh procedurally by radial extrusion (IfcRevolvedAreaSolid)");
}